

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChEllipsoidShape.cpp
# Opt level: O1

void __thiscall chrono::ChEllipsoidShape::ArchiveIN(ChEllipsoidShape *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::geometry::ChEllipsoid> specFuncA;
  undefined **local_38;
  ChEllipsoid *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 local_18;
  
  ChArchiveIn::VersionRead<chrono::ChEllipsoidShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30 = &this->gellipsoid;
  local_38 = &PTR__ChFunctorArchiveIn_00b687d8;
  local_28 = "gellipsoid";
  local_18 = 0;
  local_20 = (undefined1 *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  return;
}

Assistant:

void ChEllipsoidShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChEllipsoidShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(gellipsoid);
}